

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_manager.cpp
# Opt level: O2

RegisteredLoggingContext * __thiscall
duckdb::LogManager::RegisterLoggingContextInternal
          (RegisteredLoggingContext *__return_storage_ptr__,LogManager *this,LoggingContext *context
          )

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  idx_t iVar5;
  idx_t iVar6;
  idx_t iVar7;
  undefined3 uVar8;
  idx_t iVar9;
  InternalException *this_00;
  allocator local_39;
  string local_38;
  
  iVar9 = this->next_registered_logging_context_index;
  __return_storage_ptr__->context_id = iVar9;
  uVar8 = *(undefined3 *)&context->field_0x1;
  uVar1 = *(undefined4 *)&context->field_0x4;
  iVar5 = (context->thread_id).index;
  uVar2 = *(undefined4 *)((long)&(context->thread_id).index + 4);
  iVar6 = (context->connection_id).index;
  uVar3 = *(undefined4 *)((long)&(context->connection_id).index + 4);
  iVar7 = (context->transaction_id).index;
  uVar4 = *(undefined4 *)((long)&(context->transaction_id).index + 4);
  (__return_storage_ptr__->context).scope = context->scope;
  *(undefined3 *)&(__return_storage_ptr__->context).field_0x1 = uVar8;
  *(undefined4 *)&(__return_storage_ptr__->context).field_0x4 = uVar1;
  *(int *)&(__return_storage_ptr__->context).thread_id.index = (int)iVar5;
  *(undefined4 *)((long)&(__return_storage_ptr__->context).thread_id.index + 4) = uVar2;
  *(int *)&(__return_storage_ptr__->context).connection_id.index = (int)iVar6;
  *(undefined4 *)((long)&(__return_storage_ptr__->context).connection_id.index + 4) = uVar3;
  *(int *)&(__return_storage_ptr__->context).transaction_id.index = (int)iVar7;
  *(undefined4 *)((long)&(__return_storage_ptr__->context).transaction_id.index + 4) = uVar4;
  (__return_storage_ptr__->context).query_id.index = (context->query_id).index;
  iVar9 = iVar9 + 1;
  this->next_registered_logging_context_index = iVar9;
  if (iVar9 != 0xffffffffffffffff) {
    return __return_storage_ptr__;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Ran out of available log context ids.",&local_39);
  InternalException::InternalException(this_00,&local_38);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

RegisteredLoggingContext LogManager::RegisterLoggingContextInternal(LoggingContext &context) {
	RegisteredLoggingContext result = {next_registered_logging_context_index, context};

	next_registered_logging_context_index += 1;

	if (next_registered_logging_context_index == NumericLimits<idx_t>::Maximum()) {
		throw InternalException("Ran out of available log context ids.");
	}

	return result;
}